

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void av1_alloc_txb_buf(AV1_COMP *cpi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  AV1_COMP *cpi_00;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  long in_RDI;
  int max_sb_square;
  int plane;
  int i;
  uint8_t *entropy_ctx_ptr;
  uint16_t *eob_ptr;
  tran_low_t *tcoeff_ptr;
  int txb_unit_size;
  size_t num_tcoeffs;
  int total_max_sb_square;
  int chroma_max_sb_square;
  int luma_max_sb_square;
  int subsampling_y;
  int subsampling_x;
  int num_planes;
  int size;
  int num_sb_cols;
  int num_sb_rows;
  CoeffBufferPool *coeff_buf_pool;
  AV1_COMMON *cm;
  int local_84;
  undefined4 in_stack_ffffffffffffff90;
  int iVar14;
  undefined4 in_stack_ffffffffffffff94;
  size_t in_stack_ffffffffffffff98;
  long local_60;
  long local_58;
  
  plVar10 = (long *)(in_RDI + 0x3bf68);
  iVar5 = (*(int *)(in_RDI + 0x3c194) +
           (1 << ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x42008) + 0x24) & 0x1f)) + -1 >>
          ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x42008) + 0x24) & 0x1f)) *
          (*(int *)(in_RDI + 0x3c198) +
           (1 << ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x42008) + 0x24) & 0x1f)) + -1 >>
          ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x42008) + 0x24) & 0x1f));
  iVar6 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  iVar7 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                [*(byte *)(*(long *)(in_RDI + 0x42008) + 0x1c)] & 0x1f);
  iVar8 = iVar7 >> ((char)*(undefined4 *)(*(long *)(in_RDI + 0x42008) + 0x60) +
                    (char)*(undefined4 *)(*(long *)(in_RDI + 0x42008) + 100) & 0x1fU);
  iVar9 = iVar7 + (iVar6 + -1) * iVar8;
  cpi_00 = (AV1_COMP *)(long)iVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar9;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < cpi_00) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  uVar11 = (long)iVar5 * (long)iVar9;
  av1_free_txb_buf(cpi_00);
  pvVar12 = aom_malloc(0x248e3a);
  *(void **)(in_RDI + 0x3bf60) = pvVar12;
  if (*(long *)(in_RDI + 0x3bf60) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cpi->coeff_buffer_base");
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) < 4) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  pvVar12 = aom_memalign(in_stack_ffffffffffffff98,
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  *plVar10 = (long)pvVar12;
  if (*plVar10 == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate coeff_buf_pool->tcoeff");
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar11;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0) < 2) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  pvVar12 = aom_malloc(0x248f4a);
  *(void **)(in_RDI + 0x3bf70) = pvVar12;
  if (*(long *)(in_RDI + 0x3bf70) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate coeff_buf_pool->eobs");
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar4,0) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  pvVar12 = aom_malloc(0x248fcd);
  *(void **)(in_RDI + 0x3bf78) = pvVar12;
  if (*(long *)(in_RDI + 0x3bf78) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate coeff_buf_pool->entropy_ctx");
  }
  local_58 = *plVar10;
  local_60 = *(long *)(in_RDI + 0x3bf70);
  lVar13 = *(long *)(in_RDI + 0x3bf78);
  for (iVar9 = 0; iVar9 < iVar5; iVar9 = iVar9 + 1) {
    for (iVar14 = 0; iVar14 < iVar6; iVar14 = iVar14 + 1) {
      local_84 = iVar8;
      if (iVar14 == 0) {
        local_84 = iVar7;
      }
      *(long *)(*(long *)(in_RDI + 0x3bf60) + (long)iVar9 * 0x48 + (long)iVar14 * 8) = local_58;
      *(long *)(*(long *)(in_RDI + 0x3bf60) + (long)iVar9 * 0x48 + 0x18 + (long)iVar14 * 8) =
           local_60;
      *(long *)(*(long *)(in_RDI + 0x3bf60) + (long)iVar9 * 0x48 + 0x30 + (long)iVar14 * 8) = lVar13
      ;
      local_58 = local_58 + (long)local_84 * 4;
      local_60 = local_60 + (long)(local_84 / 0x10) * 2;
      lVar13 = lVar13 + local_84 / 0x10;
    }
  }
  return;
}

Assistant:

void av1_alloc_txb_buf(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CoeffBufferPool *coeff_buf_pool = &cpi->coeff_buffer_pool;
  const int num_sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, cm->seq_params->mib_size_log2);
  const int num_sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, cm->seq_params->mib_size_log2);
  const int size = num_sb_rows * num_sb_cols;
  const int num_planes = av1_num_planes(cm);
  const int subsampling_x = cm->seq_params->subsampling_x;
  const int subsampling_y = cm->seq_params->subsampling_y;
  const int luma_max_sb_square =
      1 << num_pels_log2_lookup[cm->seq_params->sb_size];
  const int chroma_max_sb_square =
      luma_max_sb_square >> (subsampling_x + subsampling_y);
  const int total_max_sb_square =
      (luma_max_sb_square + (num_planes - 1) * chroma_max_sb_square);
  if ((size_t)size > SIZE_MAX / (size_t)total_max_sb_square) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  const size_t num_tcoeffs = (size_t)size * (size_t)total_max_sb_square;
  const int txb_unit_size = TX_SIZE_W_MIN * TX_SIZE_H_MIN;

  av1_free_txb_buf(cpi);
  // TODO(jingning): This should be further reduced.
  CHECK_MEM_ERROR(cm, cpi->coeff_buffer_base,
                  aom_malloc(sizeof(*cpi->coeff_buffer_base) * size));
  if (sizeof(*coeff_buf_pool->tcoeff) > SIZE_MAX / num_tcoeffs) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  CHECK_MEM_ERROR(
      cm, coeff_buf_pool->tcoeff,
      aom_memalign(32, sizeof(*coeff_buf_pool->tcoeff) * num_tcoeffs));
  if (sizeof(*coeff_buf_pool->eobs) > SIZE_MAX / num_tcoeffs) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  CHECK_MEM_ERROR(
      cm, coeff_buf_pool->eobs,
      aom_malloc(sizeof(*coeff_buf_pool->eobs) * num_tcoeffs / txb_unit_size));
  if (sizeof(*coeff_buf_pool->entropy_ctx) > SIZE_MAX / num_tcoeffs) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  CHECK_MEM_ERROR(cm, coeff_buf_pool->entropy_ctx,
                  aom_malloc(sizeof(*coeff_buf_pool->entropy_ctx) *
                             num_tcoeffs / txb_unit_size));

  tran_low_t *tcoeff_ptr = coeff_buf_pool->tcoeff;
  uint16_t *eob_ptr = coeff_buf_pool->eobs;
  uint8_t *entropy_ctx_ptr = coeff_buf_pool->entropy_ctx;
  for (int i = 0; i < size; i++) {
    for (int plane = 0; plane < num_planes; plane++) {
      const int max_sb_square =
          (plane == AOM_PLANE_Y) ? luma_max_sb_square : chroma_max_sb_square;
      cpi->coeff_buffer_base[i].tcoeff[plane] = tcoeff_ptr;
      cpi->coeff_buffer_base[i].eobs[plane] = eob_ptr;
      cpi->coeff_buffer_base[i].entropy_ctx[plane] = entropy_ctx_ptr;
      tcoeff_ptr += max_sb_square;
      eob_ptr += max_sb_square / txb_unit_size;
      entropy_ctx_ptr += max_sb_square / txb_unit_size;
    }
  }
}